

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeEncodeTest.cpp
# Opt level: O3

int main(void)

{
  time_t tVar1;
  ANN *this;
  Parameters *param;
  Population *this_00;
  ArtificialPopulation *this_01;
  Population *this_02;
  ostream *poVar2;
  BSA_SpikeEncodingSynapse_param *param_00;
  BSA_SpikeEncodingSynapse *this_03;
  RateCodingSynapse *this_04;
  Network n;
  string local_d8;
  string local_b8;
  string local_98;
  Network local_78;
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  this = (ANN *)operator_new(0x40);
  ANN::ANN(this);
  ANN::setInputSize(this,1);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"tanh","");
  ANN::addLayer(this,1,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  param = (Parameters *)operator_new(0x58);
  *(undefined8 *)(param + 8) = 0;
  *(undefined8 *)(param + 0x10) = 0;
  *(undefined8 *)(param + 0x18) = 0;
  *(undefined8 *)(param + 0x20) = 0;
  *(undefined8 *)(param + 0x28) = 0;
  *(undefined8 *)(param + 0x30) = 0;
  *(undefined8 *)(param + 0x38) = 0x3ff0000000000000;
  *(undefined8 *)(param + 0x40) = 0;
  *(undefined8 *)(param + 0x48) = 0;
  *(undefined8 *)(param + 0x50) = 0;
  *(undefined8 *)param = 0x3fb999999999999a;
  this_00 = (Population *)operator_new(0x60);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"SignalGenerator","");
  Population::Population(this_00,1,&local_b8,param);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  this_01 = (ArtificialPopulation *)operator_new(0x98);
  ArtificialPopulation::ArtificialPopulation(this_01,this);
  this_02 = (Population *)operator_new(0x60);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"izhikevich","");
  Population::Population(this_02,1,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  param_00 = (BSA_SpikeEncodingSynapse_param *)operator_new(0x20);
  param_00->scale = 0.0;
  *(undefined8 *)&param_00->window = 0;
  param_00->scale = 1.0;
  param_00->window = HAMMING;
  param_00->filter_length = 24.0;
  param_00->threshold = 0.5;
  this_03 = (BSA_SpikeEncodingSynapse *)operator_new(0x98);
  BSA_SpikeEncodingSynapse::BSA_SpikeEncodingSynapse(this_03,this_00,this_02,param_00);
  this_04 = (RateCodingSynapse *)operator_new(0x70);
  RateCodingSynapse::RateCodingSynapse(this_04,this_02,(Population *)this_01);
  Network::Network(&local_78);
  Network::add(&local_78,(Synapse *)this_03);
  Network::add(&local_78,(Synapse *)this_04);
  Network::run(&local_78,100.0);
  Network::~Network(&local_78);
  return 0;
}

Assistant:

int main() 
{
    srand(time(NULL));

    ANN* ann = new ANN();
    ann->setInputSize(1);
    ann->addLayer(1, "tanh");

    // Populations
    SignalGenerator_param* paramp1 = new SignalGenerator_param();
    paramp1->f1 = 0.1;
    Population* p1 = new Population(1, "SignalGenerator", paramp1);

    ArtificialPopulation* p2 = new ArtificialPopulation(ann);

    Population* p3 = new Population(1, "izhikevich");
    cout << (long)p3 << endl;

    // Synapses
    BSA_SpikeEncodingSynapse_param* params1 = new BSA_SpikeEncodingSynapse_param();
    params1->threshold = 0.5;
    BSA_SpikeEncodingSynapse* s1 = new BSA_SpikeEncodingSynapse(p1, p3, params1);

    RateCodingSynapse* s2 = new RateCodingSynapse(p3, p2);


    // Create the network

    Network_param* n_param = new Network_param();
    n_param->dt = 0.01;
    Network n = Network();

    // Add the synapse to the network
    n.add(s1);
    n.add(s2);

    // Run the network for 100 second
    n.run(100.0);
    
    return 0;
}